

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O2

void gimage::fillGammaMap<float>
               (Image<float,_gimage::PixelTraits<float>_> *map,int depth,int from,int to,double g)

{
  float ***pppfVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  
  lVar2 = map->width;
  pppfVar1 = map->img;
  uVar3 = 0;
  uVar5 = 0;
  if (0 < from) {
    uVar5 = (ulong)(uint)from;
  }
  for (; (uVar5 != uVar3 && ((long)uVar3 < lVar2)); uVar3 = uVar3 + 1) {
    (*pppfVar1[depth])[uVar3] = -3.4028235e+38;
  }
  uVar5 = 0;
  uVar3 = 0;
  if (0 < to) {
    uVar3 = (ulong)(uint)to;
  }
  for (; (uVar3 != uVar5 && ((long)uVar5 < lVar2)); uVar5 = uVar5 + 1) {
    dVar6 = pow((double)((int)uVar5 - from) / (double)(to - from),1.0 / g);
    (*map->img[depth])[uVar5] = (float)(dVar6 * 3.4028234663852886e+38);
    lVar2 = map->width;
  }
  pppfVar1 = map->img;
  for (lVar4 = (long)to; lVar4 < lVar2; lVar4 = lVar4 + 1) {
    (*pppfVar1[depth])[lVar4] = 3.4028235e+38;
  }
  return;
}

Assistant:

void fillGammaMap(Image<T> &map, int depth, int from, int to, double g)
{
  for (int i=0; i<from && i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, map.absMinValue());
  }

  for (int i=0; i<to && i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, static_cast<T>(map.absMaxValue()*pow(static_cast<double>(i-from)/
                   (to-from), 1.0/g)));
  }

  for (int i=to; i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, map.absMaxValue());
  }
}